

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O0

bool __thiscall MeCab::Param::get<bool>(Param *this,char *key)

{
  bool bVar1;
  bool *pbVar2;
  pointer ppVar3;
  char *in_RSI;
  scoped_ptr<bool> r;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  string local_90 [32];
  scoped_ptr<bool> local_70;
  _Self local_60 [3];
  allocator local_41;
  string local_40 [32];
  _Self local_20 [3];
  byte local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x109de7);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(local_20,local_60);
  if (bVar1) {
    pbVar2 = (bool *)operator_new(1);
    *pbVar2 = false;
    scoped_ptr<bool>::scoped_ptr(&local_70,pbVar2);
    pbVar2 = scoped_ptr<bool>::operator*(&local_70);
    local_1 = *pbVar2 & 1;
    scoped_ptr<bool>::~scoped_ptr
              ((scoped_ptr<bool> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x109f08);
    std::__cxx11::string::string(local_90,(string *)&ppVar3->second);
    local_1 = ::(anonymous_namespace)::lexical_cast<bool,std::__cxx11::string>(in_stack_00000118);
    std::__cxx11::string::~string(local_90);
  }
  return (bool)(local_1 & 1);
}

Assistant:

T get(const char *key) const {
    std::map<std::string, std::string>::const_iterator it = conf_.find(key);
    if (it == conf_.end()) {
      scoped_ptr<T> r(new T());
      return *r;
    }
    return lexical_cast<T, std::string>(it->second);
  }